

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_make_constructor_op(sexp ctx,sexp self,sexp_sint_t n,sexp name,sexp type)

{
  short sVar1;
  sexp psVar2;
  
  if ((((ulong)type & 3) == 0) && (type->tag == 1)) {
    type = (sexp)((ulong)(type->value).type.tag * 2 + 1);
  }
  if (((ulong)type & 1) == 0) {
    psVar2 = sexp_type_exception(ctx,self,2,type);
    return psVar2;
  }
  sVar1 = *(short *)(*(long *)((long)&((((ctx->value).type.setters)->value).type.getters)->value +
                              ((ulong)type & 0xfffffffffffffffe) * 4 + 8) + 0x5e);
  psVar2 = sexp_alloc_tagged_aux(ctx,0x70,0x1b);
  *(undefined4 *)((long)&psVar2->value + 0x58) = 0x3007;
  (psVar2->value).type.id = (sexp)0x1;
  (psVar2->value).port.offset = 1;
  (psVar2->value).flonum_bits[0x5c] = '\0';
  (psVar2->value).type.cpl = type;
  (psVar2->value).string.length = (long)sVar1 * 2 | 1;
  (psVar2->value).opcode.func = (sexp_proc1)0x0;
  (psVar2->value).type.name = name;
  (psVar2->value).opcode.dl = (sexp)(ctx->value).opcode.func;
  return psVar2;
}

Assistant:

sexp sexp_make_constructor_op (sexp ctx, sexp self, sexp_sint_t n, sexp name, sexp type) {
  sexp_uint_t type_size;
  if (sexp_typep(type)) type = sexp_make_fixnum(sexp_type_tag(type));
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, type);
  type_size = sexp_type_size_base(sexp_type_by_index(ctx, sexp_unbox_fixnum(type)));
  return sexp_make_opcode(ctx, self, name, sexp_make_fixnum(SEXP_OPC_CONSTRUCTOR),
                          sexp_make_fixnum(SEXP_OP_MAKE), SEXP_ZERO, SEXP_ZERO,
                          SEXP_ZERO, SEXP_ZERO, SEXP_ZERO, type,
                          sexp_make_fixnum(type_size), NULL);
}